

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,1,5,1,1,5>,Eigen::Matrix<double,1,5,1,1,5>,double,double>
               (Matrix<double,_1,_5,_1,_1,_5> *dst,Matrix<double,_1,_5,_1,_1,_5> *src,
               assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  Matrix<double,_1,_5,_1,_1,_5> *src_local;
  Matrix<double,_1,_5,_1,_1,_5> *dst_local;
  
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::rows
                    (&src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>);
  cols = PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::cols
                   (&src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>);
    if (IVar2 == cols) goto LAB_0041c2ed;
  }
  PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,IVar1,cols);
LAB_0041c2ed:
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, 1, 5>, SrcXprType = Eigen::Matrix<double, 1, 5>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}